

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  Schema SVar1;
  Schema SVar2;
  Schema testListsSchema;
  DebugComparison<kj::String,_kj::String> _kjCondition;
  SchemaType<capnproto_test::capnp::test::TestLists> nativeSchema;
  Schema struct16Schema;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  Schema struct32Schema;
  Reader local_e8;
  Array<char> local_b8;
  Schema structPSchema;
  Schema struct8Schema;
  uint local_8c;
  Reader local_88;
  SchemaLoader loader;
  
  SchemaLoader::SchemaLoader(&loader);
  local_88._reader.segment = (SegmentReader *)(schemas::s_ad7beedc4ed30742 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_88);
  struct32Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  nativeSchema.super_Schema.raw = (Schema)((long)schemas::s_e41885c94393277e + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&nativeSchema.super_Schema);
  testListsSchema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  local_88._reader.segment = (SegmentReader *)(schemas::s_a6411a353090145b + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_88);
  SVar1 = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  local_88._reader.segment = (SegmentReader *)(schemas::s_c6abf1b0329e6227 + 0x48);
  struct8Schema.raw = SVar1.raw;
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&local_88);
  SVar2 = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  structPSchema.raw = SVar2.raw;
  Schema::getProto(&local_88,&nativeSchema.super_Schema);
  kj::str<capnp::schema::Node::Reader>((String *)&struct16Schema,&local_88);
  _kjCondition_8._0_8_ = struct16Schema.raw;
  struct16Schema.raw = (RawBrandedSchema *)0x0;
  Schema::getProto(&local_e8,&testListsSchema);
  kj::str<capnp::schema::Node::Reader>((String *)&local_b8,&local_e8);
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_8,(String *)&local_b8);
  kj::Array<char>::~Array(&local_b8);
  kj::Array<char>::~Array((Array<char> *)&_kjCondition_8);
  kj::Array<char>::~Array((Array<char> *)&struct16Schema);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_88,&nativeSchema.super_Schema);
    kj::str<capnp::schema::Node::Reader>((String *)&_kjCondition_8,&local_88);
    Schema::getProto(&local_e8,&testListsSchema);
    kj::str<capnp::schema::Node::Reader>((String *)&struct16Schema,&local_e8);
    kj::_::Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x2d,ERROR,
               "\"failed: expected \" \"(kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))\", _kjCondition, kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto())"
               ,(char (*) [93])
                "failed: expected (kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))"
               ,&_kjCondition,(String *)&_kjCondition_8,(String *)&struct16Schema);
    kj::Array<char>::~Array((Array<char> *)&struct16Schema);
    kj::Array<char>::~Array((Array<char> *)&_kjCondition_8);
  }
  kj::_::DebugComparison<kj::String,_kj::String>::~DebugComparison(&_kjCondition);
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        (Schema)testListsSchema.raw != nativeSchema.super_Schema.raw);
  if (kj::_::Debug::minSeverity < 3 && (Schema)testListsSchema.raw == nativeSchema.super_Schema.raw)
  {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"!(testListsSchema == nativeSchema)\", _kjCondition",
               (char (*) [52])"failed: expected !(testListsSchema == nativeSchema)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        struct32Schema.raw !=
                        (RawBrandedSchema *)(schemas::s_ad7beedc4ed30742 + 0x48));
  if (kj::_::Debug::minSeverity < 3 &&
      struct32Schema.raw == (RawBrandedSchema *)(schemas::s_ad7beedc4ed30742 + 0x48)) {
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"!(struct32Schema == Schema::from<test::TestLists::Struct32>())\", _kjCondition"
               ,(char (*) [80])
                "failed: expected !(struct32Schema == Schema::from<test::TestLists::Struct32>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        SVar1.raw != (RawBrandedSchema *)(schemas::s_a6411a353090145b + 0x48));
  if (kj::_::Debug::minSeverity < 3 &&
      SVar1.raw == (RawBrandedSchema *)(schemas::s_a6411a353090145b + 0x48)) {
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"!(struct8Schema == Schema::from<test::TestLists::Struct8>())\", _kjCondition"
               ,(char (*) [78])
                "failed: expected !(struct8Schema == Schema::from<test::TestLists::Struct8>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr =
       (char *)CONCAT71(_kjCondition.left.content.ptr._1_7_,
                        SVar2.raw != (RawBrandedSchema *)(schemas::s_c6abf1b0329e6227 + 0x48));
  if ((SVar2.raw == (RawBrandedSchema *)(schemas::s_c6abf1b0329e6227 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"!(structPSchema == Schema::from<test::TestLists::StructP>())\", _kjCondition"
               ,(char (*) [78])
                "failed: expected !(structPSchema == Schema::from<test::TestLists::StructP>())",
               (DebugExpression<bool> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr = (char *)Schema::getDependency(&testListsSchema,0xad7beedc4ed30742)
  ;
  _kjCondition.left.content.size_ = (size_t)&struct32Schema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3d166;
  _kjCondition.right.content.size_._0_1_ =
       (RawBrandedSchema *)_kjCondition.left.content.ptr == struct32Schema.raw;
  _kjCondition.right.content.ptr = &DAT_00000005;
  if ((!(bool)(undefined1)_kjCondition.right.content.size_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[102],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema\", _kjCondition"
               ,(char (*) [102])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr = (char *)Schema::getDependency(&testListsSchema,0xa6411a353090145b)
  ;
  _kjCondition.left.content.size_ = (size_t)&struct8Schema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3d166;
  _kjCondition.right.content.ptr = &DAT_00000005;
  _kjCondition.right.content.size_._0_1_ =
       (RawBrandedSchema *)_kjCondition.left.content.ptr == SVar1.raw;
  if ((!(bool)(undefined1)_kjCondition.right.content.size_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema\", _kjCondition"
               ,(char (*) [100])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  _kjCondition.left.content.ptr = (char *)Schema::getDependency(&testListsSchema,0xc6abf1b0329e6227)
  ;
  _kjCondition.left.content.size_ = (size_t)&structPSchema;
  _kjCondition.left.content.disposer = (ArrayDisposer *)anon_var_dwarf_3d166;
  _kjCondition.right.content.ptr = &DAT_00000005;
  _kjCondition.right.content.size_._0_1_ =
       (RawBrandedSchema *)_kjCondition.left.content.ptr == SVar2.raw;
  if ((!(bool)(undefined1)_kjCondition.right.content.size_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema\", _kjCondition"
               ,(char (*) [100])
                "failed: expected testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema"
               ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)&_kjCondition);
  }
  struct16Schema = Schema::getDependency(&testListsSchema,0xa8abf7a82928986c);
  Schema::getProto(&local_e8,&struct16Schema);
  local_88._reader.dataSize = local_e8._reader.dataSize;
  local_88._reader.pointerCount = local_e8._reader.pointerCount;
  local_88._reader._38_2_ = local_e8._reader._38_2_;
  local_88._reader.nestingLimit = local_e8._reader.nestingLimit;
  local_88._reader._44_4_ = local_e8._reader._44_4_;
  local_88._reader.data = local_e8._reader.data;
  local_88._reader.pointers = local_e8._reader.pointers;
  local_88._reader.segment = local_e8._reader.segment;
  local_88._reader.capTable = local_e8._reader.capTable;
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&_kjCondition,(Reader *)&local_88);
  _kjCondition_8._0_8_ = (long)_kjCondition.right.content.ptr << 0x20;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = (uint)_kjCondition.right.content.ptr == 0;
  if ((!_kjCondition_8.result) && (kj::_::Debug::minSeverity < 3)) {
    local_b8.ptr._0_4_ = 0;
    Schema::getProto(&local_e8,&struct16Schema);
    local_88._reader.dataSize = local_e8._reader.dataSize;
    local_88._reader.pointerCount = local_e8._reader.pointerCount;
    local_88._reader._38_2_ = local_e8._reader._38_2_;
    local_88._reader.nestingLimit = local_e8._reader.nestingLimit;
    local_88._reader._44_4_ = local_e8._reader._44_4_;
    local_88._reader.data = local_e8._reader.data;
    local_88._reader.pointers = local_e8._reader.pointers;
    local_88._reader.segment = local_e8._reader.segment;
    local_88._reader.capTable = local_e8._reader.capTable;
    capnp::schema::Node::Struct::Reader::getFields((Reader *)&_kjCondition,(Reader *)&local_88);
    local_8c = (uint)_kjCondition.right.content.ptr;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"(0u) == (struct16Schema.getProto().getStruct().getFields().size())\", _kjCondition, 0u, struct16Schema.getProto().getStruct().getFields().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (struct16Schema.getProto().getStruct().getFields().size())"
               ,&_kjCondition_8,(uint *)&local_b8,&local_8c);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Load) {
  SchemaLoader loader;

  Schema struct32Schema = loader.load(Schema::from<test::TestLists::Struct32>().getProto());

  auto nativeSchema = Schema::from<test::TestLists>();
  Schema testListsSchema = loader.load(nativeSchema.getProto());

  Schema struct8Schema = loader.load(Schema::from<test::TestLists::Struct8>().getProto());
  Schema structPSchema = loader.load(Schema::from<test::TestLists::StructP>().getProto());

  EXPECT_EQ(kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto()));

  EXPECT_FALSE(testListsSchema == nativeSchema);
  EXPECT_FALSE(struct32Schema == Schema::from<test::TestLists::Struct32>());
  EXPECT_FALSE(struct8Schema == Schema::from<test::TestLists::Struct8>());
  EXPECT_FALSE(structPSchema == Schema::from<test::TestLists::StructP>());

  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema);

  auto struct16Schema = testListsSchema.getDependency(typeId<test::TestLists::Struct16>());
  EXPECT_EQ(0u, struct16Schema.getProto().getStruct().getFields().size());
}